

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

void __thiscall
dynamicgraph::SignalPtr<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::plug
          (SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,SignalBase<int> *unknown_ref
          )

{
  Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *pSVar1;
  
  if (unknown_ref == (SignalBase<int> *)0x0) {
    this->signalPtr = (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)0x0;
    this->transmitAbstract = false;
  }
  else {
    pSVar1 = (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)
             __dynamic_cast(unknown_ref,&SignalBase<int>::typeinfo,
                            &Signal<Eigen::Matrix<double,-1,1,0,-1,1>,int>::typeinfo,0);
    if (pSVar1 == (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)0x0) {
      (*unknown_ref->_vptr_SignalBase[0x17])(unknown_ref);
    }
    else {
      this->transmitAbstract = false;
      this->signalPtr = pSVar1;
    }
  }
  return;
}

Assistant:

void SignalPtr<T, Time>::plug(SignalBase<Time> *unknown_ref) {
  dgTDEBUGIN(5);
  if (!unknown_ref) {
    signalPtr = NULL;
    transmitAbstract = false;
    dgTDEBUGOUT(5);
    return;
  }

  dgTDEBUG(5) << "# In  T = " << getName() << " ="
              << typeid(Signal<T, Time>::Tcopy1).name() << "{ " << std::endl;

  Signal<T, Time> *ref = dynamic_cast<Signal<T, Time> *>(unknown_ref);
  if (NULL == ref) {
    try {
      unknown_ref->checkCompatibility();
    } catch (T *t) {
      dgTDEBUG(25) << "Cast THROW ok." << std::endl;
      Signal<T, Time>::setReference(t);
      transmitAbstract = true;
      abstractTransmitter = unknown_ref;
      transmitAbstractData = t;
    } catch (...) {
      dgTDEBUG(25) << "Fatal error." << std::endl;
      transmitAbstract = false;
      DG_THROW ExceptionSignal(ExceptionSignal::PLUG_IMPOSSIBLE,
                               "Compl. Uncompatible types for plugin.",
                               "(while trying to plug <%s> on <%s>)"
                               " with types <%s> on <%s>.",
                               unknown_ref->getName().c_str(),
                               this->getName().c_str(), typeid(T).name(),
                               typeid(unknown_ref).name());
    }
  } else {
    dgTDEBUG(25) << "Cast ok." << std::endl;
    transmitAbstract = false;
    signalPtr = ref;
  }
  dgTDEBUGOUT(5);
}